

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_low_entropy_ref(aec_stream_conflict *strm)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  internal_state_conflict *piVar4;
  byte *pbVar5;
  uint *puVar6;
  int iVar7;
  code *pcVar8;
  size_t sVar9;
  ulong uVar10;
  internal_state_conflict *state;
  
  piVar4 = strm->state;
  if (piVar4->ref != 0) {
    uVar3 = strm->bits_per_sample;
    iVar7 = piVar4->bitp;
    if (iVar7 < (int)uVar3) {
      sVar9 = strm->avail_in;
      do {
        sVar9 = sVar9 - 1;
        if (sVar9 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar9;
        uVar10 = piVar4->acc << 8;
        piVar4->acc = uVar10;
        pbVar5 = strm->next_in;
        strm->next_in = pbVar5 + 1;
        piVar4->acc = *pbVar5 | uVar10;
        iVar7 = iVar7 + 8;
        piVar4->bitp = iVar7;
      } while (iVar7 < (int)uVar3);
    }
    uVar10 = strm->avail_out;
    if (uVar10 < piVar4->bytes_per_sample) {
      return 0;
    }
    puVar6 = piVar4->rsip;
    puVar1 = puVar6 + 1;
    piVar4->rsip = puVar1;
    *puVar6 = (uint)(piVar4->acc >> ((char)piVar4->bitp - (char)uVar3 & 0x3fU)) &
              (uint)(0xffffffffffffffff >> (-(char)uVar3 & 0x3fU));
    strm->avail_out = uVar10 - piVar4->bytes_per_sample;
    if (piVar4->rsi_size == (long)puVar1 - (long)piVar4->rsi_buffer >> 2) {
      (*piVar4->flush_output)(strm);
      piVar4->flush_start = piVar4->rsi_buffer;
      piVar4->rsip = piVar4->rsi_buffer;
    }
    piVar2 = &strm->state->bitp;
    *piVar2 = *piVar2 - strm->bits_per_sample;
  }
  pcVar8 = m_zero_block;
  if (piVar4->id == 1) {
    pcVar8 = m_se;
  }
  piVar4->mode = pcVar8;
  return 1;
}

Assistant:

static int m_low_entropy_ref(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->ref && copysample(strm) == 0)
        return M_EXIT;

    if(state->id == 1) {
        state->mode = m_se;
        return M_CONTINUE;
    }

    state->mode = m_zero_block;
    return M_CONTINUE;
}